

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Color ColorFromHSV(float hue,float saturation,float value)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = hue / 60.0;
  fVar1 = fmodf(fVar4 + 5.0,6.0);
  fVar5 = 4.0 - fVar1;
  if (fVar1 <= 4.0 - fVar1) {
    fVar5 = fVar1;
  }
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  if (fVar5 <= 0.0) {
    fVar5 = 0.0;
  }
  fVar2 = saturation * value;
  fVar3 = fmodf(fVar4 + 3.0,6.0);
  fVar1 = 4.0 - fVar3;
  if (fVar3 <= 4.0 - fVar3) {
    fVar1 = fVar3;
  }
  if (1.0 <= fVar1) {
    fVar1 = 1.0;
  }
  if (fVar1 <= 0.0) {
    fVar1 = 0.0;
  }
  fVar3 = fmodf(fVar4 + 1.0,6.0);
  fVar4 = 4.0 - fVar3;
  if (fVar3 <= 4.0 - fVar3) {
    fVar4 = fVar3;
  }
  if (1.0 <= fVar4) {
    fVar4 = 1.0;
  }
  if (fVar4 <= 0.0) {
    fVar4 = 0.0;
  }
  return (Color)((int)((value - fVar5 * fVar2) * 255.0) & 0xffU |
                 ((int)((value - fVar1 * fVar2) * 255.0) & 0xffU) << 8 |
                 (int)((value - fVar4 * fVar2) * 255.0) << 0x10 | 0xff000000);
}

Assistant:

Color ColorFromHSV(float hue, float saturation, float value)
{
    Color color = { 0, 0, 0, 255 };

    // Red channel
    float k = fmodf((5.0f + hue/60.0f), 6);
    float t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.r = (unsigned char)((value - value*saturation*k)*255.0f);

    // Green channel
    k = fmodf((3.0f + hue/60.0f), 6);
    t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.g = (unsigned char)((value - value*saturation*k)*255.0f);

    // Blue channel
    k = fmodf((1.0f + hue/60.0f), 6);
    t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.b = (unsigned char)((value - value*saturation*k)*255.0f);

    return color;
}